

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indented_writer.h
# Opt level: O1

void __thiscall
ctemplate::IndentedWriter::Write
          (IndentedWriter *this,string *s1,string *s2,string *s3,string *s4,string *s5,string *s6,
          string *s7)

{
  DoWrite(this,s1);
  if (s2->_M_string_length != 0) {
    DoWrite(this,s2);
  }
  if (s3->_M_string_length != 0) {
    DoWrite(this,s3);
  }
  if (s4->_M_string_length != 0) {
    DoWrite(this,s4);
  }
  if (s5->_M_string_length != 0) {
    DoWrite(this,s5);
  }
  if (s6->_M_string_length != 0) {
    DoWrite(this,s6);
  }
  if (s7->_M_string_length != 0) {
    DoWrite(this,s7);
    return;
  }
  return;
}

Assistant:

void Write(string s1,
             string s2 = string(),
             string s3 = string(),
             string s4 = string(),
             string s5 = string(),
             string s6 = string(),
             string s7 = string()) {
    DoWrite(s1);
    if (!s2.empty()) DoWrite(s2);
    if (!s3.empty()) DoWrite(s3);
    if (!s4.empty()) DoWrite(s4);
    if (!s5.empty()) DoWrite(s5);
    if (!s6.empty()) DoWrite(s6);
    if (!s7.empty()) DoWrite(s7);
  }